

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-product.c
# Opt level: O3

int coda_recognize_file(char *filename,int64_t *file_size,coda_format *file_format,
                       char **product_class,char **product_type,int *version)

{
  int iVar1;
  int iVar2;
  coda_product_definition *definition;
  coda_product *product;
  coda_product_definition *local_40;
  coda_product *local_38;
  
  local_40 = (coda_product_definition *)0x0;
  iVar1 = open_file(filename,&local_38,0);
  if (iVar1 != 0) {
    return -1;
  }
  iVar1 = coda_data_dictionary_find_definition_for_product(local_38,&local_40);
  iVar2 = -1;
  if (iVar1 != 0) goto LAB_00114a67;
  if (file_size != (int64_t *)0x0) {
    *file_size = local_38->file_size;
  }
  if (local_40 == (coda_product_definition *)0x0) {
    if (file_format != (coda_format *)0x0) {
      *file_format = local_38->format;
    }
    if (product_class != (char **)0x0) {
      *product_class = (char *)0x0;
    }
    if (product_type != (char **)0x0) {
      *product_type = (char *)0x0;
    }
    iVar1 = -1;
    if (version != (int *)0x0) goto LAB_00114a63;
  }
  else {
    if (file_format != (coda_format *)0x0) {
      *file_format = local_40->format;
    }
    if (product_class != (char **)0x0) {
      *product_class = local_40->product_type->product_class->name;
    }
    if (product_type != (char **)0x0) {
      *product_type = local_40->product_type->name;
    }
    if (version != (int *)0x0) {
      iVar1 = local_40->version;
LAB_00114a63:
      *version = iVar1;
    }
  }
  iVar2 = 0;
LAB_00114a67:
  coda_close(local_38);
  return iVar2;
}

Assistant:

LIBCODA_API int coda_recognize_file(const char *filename, int64_t *file_size, coda_format *file_format,
                                    const char **product_class, const char **product_type, int *version)
{
    coda_product_definition *definition = NULL;
    coda_product *product;

    if (open_file(filename, &product, 0) != 0)
    {
        return -1;
    }
    if (coda_data_dictionary_find_definition_for_product(product, &definition) != 0)
    {
        coda_close(product);
        return -1;
    }

    if (file_size != NULL)
    {
        *file_size = product->file_size;
    }
    if (definition == NULL)
    {
        if (file_format != NULL)
        {
            *file_format = product->format;
        }
        if (product_class != NULL)
        {
            *product_class = NULL;
        }
        if (product_type != NULL)
        {
            *product_type = NULL;
        }
        if (version != NULL)
        {
            *version = -1;
        }
    }
    else
    {
        if (file_format != NULL)
        {
            *file_format = definition->format;
        }
        if (product_class != NULL)
        {
            *product_class = definition->product_type->product_class->name;
        }
        if (product_type != NULL)
        {
            *product_type = definition->product_type->name;
        }
        if (version != NULL)
        {
            *version = definition->version;
        }
    }

    coda_close(product);

    return 0;
}